

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O1

int __thiscall
crnlib::sparse_bit_array::find_first_set_bit(sparse_bit_array *this,uint index,uint num)

{
  uint32 uVar1;
  int in_EAX;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int i_1;
  int i;
  long lVar7;
  uint32 uVar8;
  bool bVar9;
  bool bVar10;
  
  if (num == 0) {
    return -1;
  }
  while (num < 0x201 || (index & 0x1ff) != 0) {
    uVar3 = 0x20 - (index & 0x1f);
    if (num <= uVar3) {
      uVar3 = num;
    }
    if (this->m_ppGroups[index >> 9] == (uint32 *)0x0) {
LAB_0014650b:
      num = num - uVar3;
      if (num == 0) {
        bVar9 = false;
        in_EAX = -1;
        num = 0;
      }
      else {
        index = index + uVar3;
        bVar9 = true;
      }
    }
    else {
      uVar5 = (0xffffffffU >> (-(char)uVar3 & 0x1fU)) << (sbyte)(index & 0x1f) &
              this->m_ppGroups[index >> 9][(index & 0x1ff) >> 5];
      if (uVar5 != 0) {
        iVar2 = 0x20;
        lVar7 = 4;
        uVar6 = uVar5;
        do {
          if ((*(uint *)(math::count_trailing_zero_bits(unsigned_int)::B + lVar7 * 4) & uVar6) != 0)
          {
            uVar6 = uVar6 << ((byte)*(int *)(math::count_trailing_zero_bits(unsigned_int)::S +
                                            lVar7 * 4) & 0x1f);
            iVar2 = iVar2 - *(int *)(math::count_trailing_zero_bits(unsigned_int)::S + lVar7 * 4);
          }
          bVar9 = lVar7 != 0;
          lVar7 = lVar7 + -1;
        } while (bVar9);
        in_EAX = iVar2 + (index & 0xffffffe0) + -1 + (uint)(uVar6 == 0);
      }
      if (uVar5 == 0) goto LAB_0014650b;
      bVar9 = false;
    }
    if (!bVar9) {
      return in_EAX;
    }
  }
  while (0x1ff < num) {
    if (this->m_ppGroups[index >> 9] == (uint32 *)0x0) {
LAB_001465ae:
      num = num - 0x200;
      index = index + 0x200;
      bVar9 = true;
    }
    else {
      uVar4 = 0;
      bVar9 = false;
      do {
        uVar1 = this->m_ppGroups[index >> 9][uVar4];
        if (uVar1 != 0) {
          iVar2 = 0x20;
          lVar7 = 4;
          uVar8 = uVar1;
          do {
            if ((*(uint *)(math::count_trailing_zero_bits(unsigned_int)::B + lVar7 * 4) & uVar8) !=
                0) {
              uVar8 = uVar8 << ((byte)*(int *)(math::count_trailing_zero_bits(unsigned_int)::S +
                                              lVar7 * 4) & 0x1f);
              iVar2 = iVar2 - *(int *)(math::count_trailing_zero_bits(unsigned_int)::S + lVar7 * 4);
            }
            bVar10 = lVar7 != 0;
            lVar7 = lVar7 + -1;
          } while (bVar10);
          in_EAX = iVar2 + index + (int)uVar4 * 0x20 + -1 + (uint)(uVar8 == 0);
        }
        if (uVar1 != 0) break;
        bVar9 = 0xe < uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x10);
      if (bVar9) goto LAB_001465ae;
      bVar9 = false;
    }
    if (!bVar9) {
      return in_EAX;
    }
  }
  do {
    if (num == 0) {
      return -1;
    }
    uVar3 = 0x20;
    if (num < 0x20) {
      uVar3 = num;
    }
    if (this->m_ppGroups[index >> 9] == (uint32 *)0x0) {
LAB_00146650:
      num = num - uVar3;
      index = index + uVar3;
      bVar9 = true;
    }
    else {
      uVar5 = (0xffffffffU >> (-(char)uVar3 & 0x1fU)) << ((byte)index & 0x1f) &
              *(uint *)((long)this->m_ppGroups[index >> 9] + (ulong)(index >> 3 & 0x3c));
      if (uVar5 != 0) {
        iVar2 = 0x20;
        lVar7 = 4;
        uVar6 = uVar5;
        do {
          if ((*(uint *)(math::count_trailing_zero_bits(unsigned_int)::B + lVar7 * 4) & uVar6) != 0)
          {
            uVar6 = uVar6 << ((byte)*(int *)(math::count_trailing_zero_bits(unsigned_int)::S +
                                            lVar7 * 4) & 0x1f);
            iVar2 = iVar2 - *(int *)(math::count_trailing_zero_bits(unsigned_int)::S + lVar7 * 4);
          }
          bVar9 = lVar7 != 0;
          lVar7 = lVar7 + -1;
        } while (bVar9);
        in_EAX = iVar2 + (index & 0xffffffe0) + -1 + (uint)(uVar6 == 0);
      }
      if (uVar5 == 0) goto LAB_00146650;
      bVar9 = false;
    }
    if (!bVar9) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

int sparse_bit_array::find_first_set_bit(uint index, uint num) const
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return -1;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            const uint group_bit_ofs = index & cBitsPerGroupMask;
            const uint dword_bit_ofs = group_bit_ofs & 31;

            const uint max_bits_to_examine = 32 - dword_bit_ofs;
            const uint bits_to_examine = math::minimum(max_bits_to_examine, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint bits = pGroup[group_bit_ofs >> 5] & (msk << dword_bit_ofs);
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);
                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            if (!num)
            {
                return -1;
            }

            index += bits_to_examine;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                for (uint i = 0; i < cDWORDsPerGroup; i++)
                {
                    uint32 bits = pGroup[i];
                    if (bits)
                    {
                        uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                        int set_index = num_trailing_zeros + index + (i << 5);
                        CRNLIB_ASSERT(get_bit(set_index));
                        return set_index;
                    }
                }
            }

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint bits_to_examine = math::minimum(32U, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                uint group_bit_ofs = index & cBitsPerGroupMask;

                uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint32 bits = pGroup[group_bit_ofs >> 5] & (msk << (group_bit_ofs & 31));
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            index += bits_to_examine;
        }

        return -1;
    }